

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

keypress textui_textblock_show(textblock *tb,region orig_area,char *header)

{
  keycode_t kVar1;
  region rVar2;
  size_t n_lines;
  wchar_t *pwVar3;
  uint8_t *puVar4;
  ulong uVar5;
  int iVar6;
  wchar_t wVar7;
  uint uVar8;
  wchar_t n;
  ulong uVar9;
  keypress kVar10;
  keypress kVar11;
  region rVar12;
  region area;
  size_t *line_lengths;
  size_t *line_starts;
  region local_60;
  size_t *local_50;
  size_t *local_48;
  uint local_3c;
  ulong local_38;
  
  rVar12 = region_calculate(orig_area);
  local_48 = (size_t *)0x0;
  local_50 = (size_t *)0x0;
  n = rVar12.width;
  n_lines = textblock_calculate_lines(tb,&local_48,&local_50,(long)n);
  screen_save();
  local_60.page_rows = rVar12.page_rows;
  wVar7 = local_60.page_rows;
  local_60._0_12_ = rVar12._0_12_;
  local_60.page_rows = local_60.page_rows + L'\xfffffffe';
  if (header != (char *)0x0) {
    local_60.page_rows = wVar7 + L'\xfffffffd';
    rVar2 = local_60;
    local_60.col = rVar12.col;
    local_60.row = rVar12.row;
    Term_erase(local_60.col,local_60.row,n);
    Term_putstr(local_60.col,local_60.row,L'\xffffffff',L'\x0e',header);
    local_60._8_8_ = rVar2._8_8_;
    local_60.row = local_60.row + L'\x01';
  }
  iVar6 = (int)n_lines;
  if (n_lines <= (ulong)(long)local_60.page_rows) {
    pwVar3 = textblock_text(tb);
    puVar4 = textblock_attrs(tb);
    display_area(pwVar3,puVar4,local_48,local_50,n_lines,local_60,0);
    Term_erase(local_60.col,local_60.row + iVar6,n);
    wVar7 = iVar6 + local_60.row + L'\x01';
    Term_erase(local_60.col,wVar7,n);
    Term_putstr(local_60.col,wVar7,L'\xffffffff',L'\x0e',"(Press any key to continue.)");
    kVar10 = inkey();
    uVar9 = kVar10._0_8_ >> 0x20;
LAB_001fe755:
    mem_free(local_48);
    mem_free(local_50);
    event_signal(EVENT_MESSAGE_FLUSH);
    Term_load();
    screen_save_depth = screen_save_depth + -1;
    kVar11._0_8_ = kVar10._0_8_ & 0xffffffff | uVar9 << 0x20;
    kVar11._8_4_ = kVar10._8_4_;
    return kVar11;
  }
  Term_erase(local_60.col,local_60.row + local_60.page_rows,n);
  wVar7 = local_60.row + local_60.page_rows + L'\x01';
  Term_erase(local_60.col,wVar7,n);
  Term_putstr(local_60.col,wVar7,L'\xffffffff',L'\x0e',"(Up/down or ESCAPE to exit.)");
  local_3c = iVar6 - local_60.page_rows;
  uVar8 = 0;
  local_38 = (long)local_60.page_rows;
LAB_001fe61b:
  pwVar3 = textblock_text(tb);
  puVar4 = textblock_attrs(tb);
  display_area(pwVar3,puVar4,local_48,local_50,n_lines,local_60,(long)(int)uVar8);
  kVar10 = inkey();
  uVar9 = kVar10._0_8_ >> 0x20;
  kVar1 = kVar10.code;
  uVar5 = (ulong)(kVar1 - 0x5b);
  if (kVar1 - 0x5b < 0x29) {
    if (uVar5 == 0x25) {
      uVar8 = uVar8 + 1;
    }
    else {
      if (uVar5 != 0x28) {
        if ((0x20400005UL >> (uVar5 & 0x3f) & 1) == 0) goto LAB_001fe696;
        goto LAB_001fe755;
      }
      uVar8 = uVar8 - 1;
    }
  }
  else {
LAB_001fe696:
    if (kVar1 == 0x20) {
      uVar8 = uVar8 + (int)local_38;
    }
    else if (kVar1 == 0xe000) goto LAB_001fe755;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  if (n_lines < uVar8 + local_38) {
    uVar8 = local_3c;
  }
  goto LAB_001fe61b;
}

Assistant:

struct keypress textui_textblock_show(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	struct keypress ch = KEYPRESS_NULL;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	screen_save();

	/* make room for the footer */
	area.page_rows -= 2;

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows) {
		int start_line = 0;

		Term_erase(area.col, area.row + area.page_rows, area.width);
		Term_erase(area.col, area.row + area.page_rows + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Up/down or ESCAPE to exit.)",
				area.row + area.page_rows + 1, area.col);

		/* Pager mode */
		while (1) {			

			display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
					line_lengths, n_lines, area, start_line);

			ch = inkey();
			if (ch.code == ARROW_UP)
				start_line--;
			else if (ch.code == ESCAPE || ch.code == 'q' || ch.code == 'x')
				break;
			else if (ch.code == ']' || ch.code == '[')
				/* Special case to deal with monster and object lists -
				 * see bug #2120 */
				break;
			else if (ch.code == ARROW_DOWN)
				start_line++;
			else if (ch.code == ' ')
				start_line += area.page_rows;

			if (start_line < 0)
				start_line = 0;
			if (start_line + (size_t) area.page_rows > n_lines)
				start_line = n_lines - area.page_rows;
		}
	} else {
		display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
				line_lengths, n_lines, area, 0);

		Term_erase(area.col, area.row + n_lines, area.width);
		Term_erase(area.col, area.row + n_lines + 1, area.width);
		c_put_str(COLOUR_L_BLUE, "(Press any key to continue.)",
				area.row + n_lines + 1, area.col);
		ch = inkey();
	}

	mem_free(line_starts);
	mem_free(line_lengths);

	screen_load();

	return (ch);
}